

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O0

int __thiscall ModbusAnalyzer::ASCII2INT(ModbusAnalyzer *this,char value)

{
  char value_local;
  ModbusAnalyzer *this_local;
  
  switch(value) {
  case '0':
    this_local._4_4_ = 0;
    break;
  case '1':
    this_local._4_4_ = 1;
    break;
  case '2':
    this_local._4_4_ = 2;
    break;
  case '3':
    this_local._4_4_ = 3;
    break;
  case '4':
    this_local._4_4_ = 4;
    break;
  case '5':
    this_local._4_4_ = 5;
    break;
  case '6':
    this_local._4_4_ = 6;
    break;
  case '7':
    this_local._4_4_ = 7;
    break;
  case '8':
    this_local._4_4_ = 8;
    break;
  case '9':
    this_local._4_4_ = 9;
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case 'A':
    this_local._4_4_ = 10;
    break;
  case 'B':
    this_local._4_4_ = 0xb;
    break;
  case 'C':
    this_local._4_4_ = 0xc;
    break;
  case 'D':
    this_local._4_4_ = 0xd;
    break;
  case 'E':
    this_local._4_4_ = 0xe;
    break;
  case 'F':
    this_local._4_4_ = 0xf;
  }
  return this_local._4_4_;
}

Assistant:

int ModbusAnalyzer::ASCII2INT( char value )
{
    switch( value )
    {
    case '0':
        return 0;
        break;
    case '1':
        return 1;
        break;
    case '2':
        return 2;
        break;
    case '3':
        return 3;
        break;
    case '4':
        return 4;
        break;
    case '5':
        return 5;
        break;
    case '6':
        return 6;
        break;
    case '7':
        return 7;
        break;
    case '8':
        return 8;
        break;
    case '9':
        return 9;
        break;
    case 'A':
        return 0xA;
        break;
    case 'B':
        return 0xB;
        break;
    case 'C':
        return 0xC;
        break;
    case 'D':
        return 0xD;
        break;
    case 'E':
        return 0xE;
        break;
    case 'F':
        return 0xF;
        break;
    default:
        return 0;
    }
}